

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O2

void __thiscall soul::heart::Parser::scanInput(Parser *this,ScannedTopLevelItem *item)

{
  Identifier *this_00;
  pool_ptr<soul::Module> *this_01;
  bool bVar1;
  Module *pMVar2;
  InputDeclaration *pIVar3;
  Identifier IVar4;
  string *name;
  Identifier *args;
  CodeLocation errorLocation;
  CodeLocation local_78;
  pool_ref<soul::heart::InputDeclaration> local_68;
  CompileMessage local_60;
  
  local_78.sourceCode.object =
       (SourceCodeText *)
       (this->
       super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
       ).location.location.data;
  std::vector<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>::emplace_back<soul::UTF8Reader>
            (&item->inputDecls,(UTF8Reader *)&local_78);
  this_01 = &this->module;
  pMVar2 = pool_ptr<soul::Module>::operator->(this_01);
  pIVar3 = Module::allocate<soul::heart::InputDeclaration,soul::CodeLocation&>
                     (pMVar2,&(this->
                              super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                              ).location);
  IVar4 = parseGeneralIdentifier(this);
  this_00 = &(pIVar3->super_IODeclaration).name;
  (pIVar3->super_IODeclaration).name.name = IVar4.name;
  local_78.sourceCode.object =
       (this->
       super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
       ).location.sourceCode.object;
  if (local_78.sourceCode.object != (SourceCodeText *)0x0) {
    ((local_78.sourceCode.object)->super_RefCountedObject).refCount =
         ((local_78.sourceCode.object)->super_RefCountedObject).refCount + 1;
  }
  local_78.location.data =
       (this->
       super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
       ).location.location.data;
  name = Identifier::operator_cast_to_string_(this_00);
  bVar1 = isReservedFunctionName(name);
  if (!bVar1) {
    pMVar2 = pool_ptr<soul::Module>::operator->(this_01);
    (pIVar3->super_IODeclaration).index =
         (uint32_t)
         ((ulong)((long)(pMVar2->inputs).
                        super__Vector_base<soul::pool_ref<soul::heart::InputDeclaration>,_std::allocator<soul::pool_ref<soul::heart::InputDeclaration>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(pMVar2->inputs).
                       super__Vector_base<soul::pool_ref<soul::heart::InputDeclaration>,_std::allocator<soul::pool_ref<soul::heart::InputDeclaration>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) >> 3);
    pMVar2 = pool_ptr<soul::Module>::operator->(this_01);
    local_68.object = pIVar3;
    std::
    vector<soul::pool_ref<soul::heart::InputDeclaration>,std::allocator<soul::pool_ref<soul::heart::InputDeclaration>>>
    ::emplace_back<soul::pool_ref<soul::heart::InputDeclaration>>
              ((vector<soul::pool_ref<soul::heart::InputDeclaration>,std::allocator<soul::pool_ref<soul::heart::InputDeclaration>>>
                *)&pMVar2->inputs,&local_68);
    skipPastNextOccurrenceOf(this,(TokenType)0x2743e3);
    RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr(&local_78.sourceCode);
    return;
  }
  Errors::invalidEndpointName<soul::Identifier&>(&local_60,(Errors *)this_00,args);
  CodeLocation::throwError(&local_78,&local_60);
}

Assistant:

void scanInput (ScannedTopLevelItem& item)
    {
        item.inputDecls.push_back (getCurrentTokeniserPosition());
        auto& inputDeclaration = module->allocate<heart::InputDeclaration> (location);
        inputDeclaration.name = parseGeneralIdentifier();

        auto errorLocation = location;
        if (isReservedFunctionName (inputDeclaration.name))
            errorLocation.throwError (Errors::invalidEndpointName (inputDeclaration.name));

        inputDeclaration.index = (uint32_t) module->inputs.size();

        module->inputs.push_back (inputDeclaration);
        skipPastNextOccurrenceOf (HEARTOperator::semicolon);
    }